

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O2

size_t URL_PrintableCharSize(uchar charVal)

{
  undefined3 in_register_00000039;
  
  if ((((0x2e < CONCAT31(in_register_00000039,charVal)) ||
       ((0x670200000001U >> ((ulong)CONCAT31(in_register_00000039,charVal) & 0x3f) & 1) == 0)) &&
      (9 < (byte)(charVal - 0x30))) &&
     ((charVal != '_' && (0x19 < (byte)((charVal & 0xdf) + 0xbf))))) {
    return (ulong)(charVal >> 7) * 3 + 3;
  }
  return 1;
}

Assistant:

static size_t URL_PrintableCharSize(unsigned char charVal)
{
    size_t size;
    if (IS_PRINTABLE(charVal))
    {
        size = 1;
    }
    else
    {
        if (charVal < 0x80)
        {
            size = 3;
        }
        else
        {
            size = 6;
        }
    }
    return size;
}